

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.h
# Opt level: O2

double ipx::DotColumn(SparseMatrix *A,Int j,Vector *rhs)

{
  pointer piVar1;
  Int p;
  long lVar2;
  double dVar3;
  
  piVar1 = (A->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = 0.0;
  for (lVar2 = (long)piVar1[j]; lVar2 < piVar1[(long)j + 1]; lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + rhs->_M_data
                    [(A->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar2]] *
                    (A->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar2];
  }
  return dVar3;
}

Assistant:

Int begin(Int j) const { return colptr_[j]; }